

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O0

void __thiscall
trento::Event::compute_nuclear_thickness
          (Event *this,Nucleus *nucleus,NucleonCommon *nucleon_common,Grid *TX)

{
  bool bVar1;
  int iVar2;
  element *idx;
  const_reference pvVar3;
  int *piVar4;
  reference pdVar5;
  int iVar6;
  const_multi_array_ref<double,_2UL,_double_*> *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int ix;
  int iy;
  int iymax;
  int iymin;
  int ixmax;
  int ixmin;
  array<double,_4UL> boundary;
  NucleonData *nucleon;
  const_iterator __end1;
  const_iterator __begin1;
  Nucleus *__range1;
  Nucleus *in_stack_fffffffffffffee8;
  array<double,_4UL> *in_stack_fffffffffffffef0;
  sub_array<double,_1UL> *in_stack_ffffffffffffff20;
  index in_stack_ffffffffffffff30;
  multi_array_ref<double,_2UL> *in_stack_ffffffffffffff38;
  NucleonData *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int iVar11;
  int in_stack_ffffffffffffff54;
  int iVar12;
  int iVar13;
  int local_98 [3];
  int local_8c;
  int local_88 [3];
  int local_7c;
  int local_78 [3];
  int local_6c;
  reference local_48;
  NucleonData *local_40;
  __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_38;
  undefined8 local_30;
  undefined8 local_28;
  const_multi_array_ref<double,_2UL,_double_*> *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  idx = boost::multi_array_ref<double,_2UL>::origin((multi_array_ref<double,_2UL> *)in_RCX);
  boost::multi_array_ref<double,_2UL>::origin((multi_array_ref<double,_2UL> *)local_20);
  boost::const_multi_array_ref<double,_2UL,_double_*>::num_elements(local_20);
  local_28 = 0;
  std::fill<double*,double>
            (in_stack_fffffffffffffef0->_M_elems,(double *)in_stack_fffffffffffffee8,
             (double *)0x12e0f0);
  local_30 = local_10;
  local_38._M_current = (NucleonData *)Nucleus::begin(in_stack_fffffffffffffee8);
  local_40 = (NucleonData *)Nucleus::end(in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                             *)in_stack_fffffffffffffef0,
                            (__normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator*(&local_38);
    bVar1 = NucleonData::is_participant(local_48);
    if (bVar1) {
      *(int *)(in_RDI + 0x1b8) = *(int *)(in_RDI + 0x1b8) + 1;
      NucleonCommon::boundary
                ((NucleonCommon *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      pvVar3 = std::array<double,_4UL>::operator[]
                         (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      local_78[2] = (int)((*pvVar3 + *(double *)(in_RDI + 0x38)) / *(double *)(in_RDI + 0x28));
      local_78[1] = 0;
      local_78[0] = *(int *)(in_RDI + 0x30) + -1;
      piVar4 = anon_unknown_0::clip<int>(local_78 + 2,local_78 + 1,local_78);
      local_6c = *piVar4;
      pvVar3 = std::array<double,_4UL>::operator[]
                         (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      local_88[2] = (int)((*pvVar3 + *(double *)(in_RDI + 0x38)) / *(double *)(in_RDI + 0x28));
      local_88[1] = 0;
      local_88[0] = *(int *)(in_RDI + 0x30) + -1;
      piVar4 = anon_unknown_0::clip<int>(local_88 + 2,local_88 + 1,local_88);
      local_7c = *piVar4;
      pvVar3 = std::array<double,_4UL>::operator[]
                         (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      local_98[2] = (int)((*pvVar3 + *(double *)(in_RDI + 0x38)) / *(double *)(in_RDI + 0x28));
      local_98[1] = 0;
      local_98[0] = *(int *)(in_RDI + 0x30) + -1;
      piVar4 = anon_unknown_0::clip<int>(local_98 + 2,local_98 + 1,local_98);
      local_8c = *piVar4;
      pvVar3 = std::array<double,_4UL>::operator[]
                         (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      iVar6 = (int)((*pvVar3 + *(double *)(in_RDI + 0x38)) / *(double *)(in_RDI + 0x28));
      iVar12 = 0;
      iVar2 = *(int *)(in_RDI + 0x30) + -1;
      piVar4 = anon_unknown_0::clip<int>
                         ((int *)&stack0xffffffffffffff60,(int *)&stack0xffffffffffffff5c,
                          (int *)&stack0xffffffffffffff58);
      iVar13 = *piVar4;
      for (in_stack_ffffffffffffff54 = local_8c; iVar11 = local_6c,
          in_stack_ffffffffffffff54 <= iVar13;
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
        for (; iVar11 <= local_7c; iVar11 = iVar11 + 1) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(in_RDI + 0x28);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(in_RDI + 0x38);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (double)iVar11 + 0.5;
          vfmsub213sd_fma(auVar7,auVar8,auVar10);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (double)in_stack_ffffffffffffff54 + 0.5;
          vfmsub213sd_fma(auVar7,auVar9,auVar10);
          in_stack_fffffffffffffef0 =
               (array<double,_4UL> *)
               NucleonCommon::thickness
                         ((NucleonCommon *)CONCAT44(iVar13,iVar6),
                          (NucleonData *)CONCAT44(iVar12,iVar2),
                          (double)CONCAT44(in_stack_ffffffffffffff54,iVar11),
                          (double)in_stack_ffffffffffffff48);
          boost::multi_array_ref<double,_2UL>::operator[]
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
          pdVar5 = boost::detail::multi_array::sub_array<double,_1UL>::operator[]
                             (in_stack_ffffffffffffff20,(index)idx);
          *pdVar5 = (double)in_stack_fffffffffffffef0 + *pdVar5;
          boost::detail::multi_array::sub_array<double,_1UL>::~sub_array
                    ((sub_array<double,_1UL> *)0x12e42a);
        }
        in_stack_ffffffffffffff50 = iVar11;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void Event::compute_nuclear_thickness(
    const Nucleus& nucleus, const NucleonCommon& nucleon_common, Grid& TX) {
  // Construct the thickness grid by looping over participants and adding each
  // to a small subgrid within its radius.  Compared to the other possibility
  // (grid cells as the outer loop and participants as the inner loop), this
  // reduces the number of required distance-squared calculations by a factor of
  // ~20 (depending on the nucleon size).  The Event unit test verifies that the
  // two methods agree.

  // Wipe grid with zeros.
  std::fill(TX.origin(), TX.origin() + TX.num_elements(), 0.);

  // Deposit each participant onto the grid.
  for (const auto& nucleon : nucleus) {
    if (!nucleon.is_participant())
      continue;

    ++npart_;

    // Get nucleon subgrid boundary {xmin, xmax, ymin, ymax}.
    const auto boundary = nucleon_common.boundary(nucleon);

    // Determine min & max indices of nucleon subgrid.
    int ixmin = clip(static_cast<int>((boundary[0]+xymax_)/dxy_), 0, nsteps_-1);
    int ixmax = clip(static_cast<int>((boundary[1]+xymax_)/dxy_), 0, nsteps_-1);
    int iymin = clip(static_cast<int>((boundary[2]+xymax_)/dxy_), 0, nsteps_-1);
    int iymax = clip(static_cast<int>((boundary[3]+xymax_)/dxy_), 0, nsteps_-1);

    // Add profile to grid.
    for (auto iy = iymin; iy <= iymax; ++iy) {
      for (auto ix = ixmin; ix <= ixmax; ++ix) {
        TX[iy][ix] += nucleon_common.thickness(
          nucleon, (ix+.5)*dxy_ - xymax_, (iy+.5)*dxy_ - xymax_
        );
      }
    }
  }
}